

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBase.cpp
# Opt level: O2

void __thiscall DataBase::printInVarMap(DataBase *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  double dVar4;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pmVar1 = this->in_var_map;
  p_Var3 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)(p_Var3 + 1));
    std::operator<<(poVar2,": ");
    dVar4 = (double)(**(code **)**(undefined8 **)(p_Var3 + 2))();
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"  ---  ");
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    pmVar1 = this->in_var_map;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void DataBase::printInVarMap() {
  map<string, Variable *>::iterator it;
  cout << endl;
  for (it = this->in_var_map->begin(); it != in_var_map->end(); it++) {
    cout << (*it).first << ": " << (*it).second->calculate() <<
         "  ---  ";
  }
  cout << endl;
}